

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrans_avx2.c
# Opt level: O2

void itrans_dct2_h8_w8_avx2(s16 *src,s16 *dst,int bit_depth)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  uint uVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  
  auVar1 = vpunpcklwd_avx(*(undefined1 (*) [16])src,*(undefined1 (*) [16])(src + 0x20));
  auVar20 = vpunpckhwd_avx(*(undefined1 (*) [16])src,*(undefined1 (*) [16])(src + 0x20));
  auVar27._0_16_ = ZEXT116(0) * auVar20 + ZEXT116(1) * auVar1;
  auVar27._16_16_ = ZEXT116(1) * auVar20;
  auVar6._8_2_ = 0x20;
  auVar6._0_8_ = 0x20002000200020;
  auVar6._10_2_ = 0x20;
  auVar6._12_2_ = 0x20;
  auVar6._14_2_ = 0x20;
  auVar6._16_2_ = 0x20;
  auVar6._18_2_ = 0x20;
  auVar6._20_2_ = 0x20;
  auVar6._22_2_ = 0x20;
  auVar6._24_2_ = 0x20;
  auVar6._26_2_ = 0x20;
  auVar6._28_2_ = 0x20;
  auVar6._30_2_ = 0x20;
  auVar18 = vpmaddwd_avx2(auVar27,auVar6);
  auVar1 = vpunpcklwd_avx(*(undefined1 (*) [16])(src + 0x10),*(undefined1 (*) [16])(src + 0x30));
  auVar20 = vpunpckhwd_avx(*(undefined1 (*) [16])(src + 0x10),*(undefined1 (*) [16])(src + 0x30));
  auVar31._0_16_ = ZEXT116(0) * auVar20 + ZEXT116(1) * auVar1;
  auVar31._16_16_ = ZEXT116(1) * auVar20;
  auVar7._8_4_ = 0x11002a;
  auVar7._0_8_ = 0x11002a0011002a;
  auVar7._12_4_ = 0x11002a;
  auVar7._16_4_ = 0x11002a;
  auVar7._20_4_ = 0x11002a;
  auVar7._24_4_ = 0x11002a;
  auVar7._28_4_ = 0x11002a;
  auVar13 = vpmaddwd_avx2(auVar31,auVar7);
  auVar22 = vpaddd_avx2(auVar18,auVar13);
  auVar29._8_4_ = 0x10;
  auVar29._0_8_ = 0x1000000010;
  auVar29._12_4_ = 0x10;
  auVar29._16_4_ = 0x10;
  auVar29._20_4_ = 0x10;
  auVar29._24_4_ = 0x10;
  auVar29._28_4_ = 0x10;
  auVar16 = vpaddd_avx2(auVar29,auVar22);
  auVar1 = vpunpcklwd_avx(*(undefined1 (*) [16])(src + 0x28),*(undefined1 (*) [16])(src + 0x38));
  auVar20 = vpunpckhwd_avx(*(undefined1 (*) [16])(src + 0x28),*(undefined1 (*) [16])(src + 0x38));
  auVar32._0_16_ = ZEXT116(0) * auVar20 + ZEXT116(1) * auVar1;
  auVar32._16_16_ = ZEXT116(1) * auVar20;
  auVar8._8_4_ = 0x90019;
  auVar8._0_8_ = 0x9001900090019;
  auVar8._12_4_ = 0x90019;
  auVar8._16_4_ = 0x90019;
  auVar8._20_4_ = 0x90019;
  auVar8._24_4_ = 0x90019;
  auVar8._28_4_ = 0x90019;
  auVar22 = vpmaddwd_avx2(auVar32,auVar8);
  auVar1 = vpunpcklwd_avx(*(undefined1 (*) [16])(src + 8),*(undefined1 (*) [16])(src + 0x18));
  auVar20 = vpunpckhwd_avx(*(undefined1 (*) [16])(src + 8),*(undefined1 (*) [16])(src + 0x18));
  auVar21._8_4_ = 0x26002c;
  auVar21._0_8_ = 0x26002c0026002c;
  auVar21._12_4_ = 0x26002c;
  auVar21._16_4_ = 0x26002c;
  auVar21._20_4_ = 0x26002c;
  auVar21._24_4_ = 0x26002c;
  auVar21._28_4_ = 0x26002c;
  auVar9._0_16_ = ZEXT116(0) * auVar20 + ZEXT116(1) * auVar1;
  auVar9._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar20;
  auVar14 = vpmaddwd_avx2(auVar9,auVar21);
  auVar14 = vpaddd_avx2(auVar22,auVar14);
  auVar13 = vpsubd_avx2(auVar18,auVar13);
  auVar15._8_4_ = 0xffd40026;
  auVar15._0_8_ = 0xffd40026ffd40026;
  auVar15._12_4_ = 0xffd40026;
  auVar15._16_4_ = 0xffd40026;
  auVar15._20_4_ = 0xffd40026;
  auVar15._24_4_ = 0xffd40026;
  auVar15._28_4_ = 0xffd40026;
  auVar17._8_4_ = 0xffe70009;
  auVar17._0_8_ = 0xffe70009ffe70009;
  auVar17._12_4_ = 0xffe70009;
  auVar17._16_4_ = 0xffe70009;
  auVar17._20_4_ = 0xffe70009;
  auVar17._24_4_ = 0xffe70009;
  auVar17._28_4_ = 0xffe70009;
  auVar22 = vpmaddwd_avx2(auVar32,auVar15);
  auVar18 = vpmaddwd_avx2(auVar9,auVar17);
  auVar11 = vpaddd_avx2(auVar22,auVar18);
  auVar22 = vpaddd_avx2(auVar16,auVar14);
  auVar18 = vpsrad_avx2(auVar22,5);
  auVar19 = vpaddd_avx2(auVar29,auVar13);
  auVar22 = vpsubd_avx2(auVar19,auVar11);
  auVar22 = vpsrad_avx2(auVar22,5);
  auVar22 = vpackssdw_avx2(auVar18,auVar22);
  auVar25._8_4_ = 0x260009;
  auVar25._0_8_ = 0x26000900260009;
  auVar25._12_4_ = 0x260009;
  auVar25._16_4_ = 0x260009;
  auVar25._20_4_ = 0x260009;
  auVar25._24_4_ = 0x260009;
  auVar25._28_4_ = 0x260009;
  auVar18 = vpmaddwd_avx2(auVar32,auVar25);
  auVar26._8_4_ = 0xffd40019;
  auVar26._0_8_ = 0xffd40019ffd40019;
  auVar26._12_4_ = 0xffd40019;
  auVar26._16_4_ = 0xffd40019;
  auVar26._20_4_ = 0xffd40019;
  auVar26._24_4_ = 0xffd40019;
  auVar26._28_4_ = 0xffd40019;
  auVar13 = vpmaddwd_avx2(auVar26,auVar9);
  auVar13 = vpaddd_avx2(auVar18,auVar13);
  auVar24._8_4_ = 0xffe00020;
  auVar24._0_8_ = 0xffe00020ffe00020;
  auVar24._12_4_ = 0xffe00020;
  auVar24._16_4_ = 0xffe00020;
  auVar24._20_4_ = 0xffe00020;
  auVar24._24_4_ = 0xffe00020;
  auVar24._28_4_ = 0xffe00020;
  auVar12._8_4_ = 0xffd60011;
  auVar12._0_8_ = 0xffd60011ffd60011;
  auVar12._12_4_ = 0xffd60011;
  auVar12._16_4_ = 0xffd60011;
  auVar12._20_4_ = 0xffd60011;
  auVar12._24_4_ = 0xffd60011;
  auVar12._28_4_ = 0xffd60011;
  auVar18 = vpmaddwd_avx2(auVar27,auVar24);
  auVar10 = vpmaddwd_avx2(auVar31,auVar12);
  auVar23 = vpsubd_avx2(auVar18,auVar10);
  auVar18 = vpaddd_avx2(auVar18,auVar10);
  auVar10 = vpaddd_avx2(auVar29,auVar23);
  auVar23 = vpaddd_avx2(auVar18,auVar29);
  auVar28._8_4_ = 0xffe7ffd4;
  auVar28._0_8_ = 0xffe7ffd4ffe7ffd4;
  auVar28._12_4_ = 0xffe7ffd4;
  auVar28._16_4_ = 0xffe7ffd4;
  auVar28._20_4_ = 0xffe7ffd4;
  auVar28._24_4_ = 0xffe7ffd4;
  auVar28._28_4_ = 0xffe7ffd4;
  auVar18 = vpmaddwd_avx2(auVar32,auVar28);
  auVar30._8_4_ = 0xfff70026;
  auVar30._0_8_ = 0xfff70026fff70026;
  auVar30._12_4_ = 0xfff70026;
  auVar30._16_4_ = 0xfff70026;
  auVar30._20_4_ = 0xfff70026;
  auVar30._24_4_ = 0xfff70026;
  auVar30._28_4_ = 0xfff70026;
  auVar9 = vpmaddwd_avx2(auVar30,auVar9);
  auVar9 = vpaddd_avx2(auVar18,auVar9);
  auVar18 = vpaddd_avx2(auVar10,auVar13);
  auVar33 = vpsrad_avx2(auVar18,5);
  auVar18 = vpsubd_avx2(auVar23,auVar9);
  auVar18 = vpsrad_avx2(auVar18,5);
  auVar18 = vpackssdw_avx2(auVar33,auVar18);
  auVar23 = vpaddd_avx2(auVar23,auVar9);
  auVar13 = vpsubd_avx2(auVar10,auVar13);
  auVar10 = vpsrad_avx2(auVar23,5);
  auVar13 = vpsrad_avx2(auVar13,5);
  auVar13 = vpackssdw_avx2(auVar10,auVar13);
  auVar11 = vpaddd_avx2(auVar19,auVar11);
  auVar16 = vpsubd_avx2(auVar16,auVar14);
  auVar14 = vpsrad_avx2(auVar11,5);
  auVar16 = vpsrad_avx2(auVar16,5);
  auVar16 = vpackssdw_avx2(auVar14,auVar16);
  auVar14 = vpunpcklwd_avx2(auVar22,auVar18);
  auVar22 = vpunpckhwd_avx2(auVar22,auVar18);
  auVar11 = vpunpcklwd_avx2(auVar13,auVar16);
  auVar18 = vpunpckhwd_avx2(auVar13,auVar16);
  auVar13 = vpunpckhwd_avx2(auVar14,auVar11);
  auVar16 = vpunpckhwd_avx2(auVar22,auVar18);
  auVar19 = vpunpcklqdq_avx2(auVar13,auVar16);
  auVar13 = vpunpckhqdq_avx2(auVar13,auVar16);
  auVar16 = vpunpcklwd_avx2(auVar14,auVar11);
  auVar22 = vpunpcklwd_avx2(auVar22,auVar18);
  auVar11 = vpunpcklqdq_avx2(auVar16,auVar22);
  auVar22 = vpunpckhqdq_avx2(auVar16,auVar22);
  auVar2 = vpunpcklwd_avx(auVar22._0_16_,auVar13._0_16_);
  auVar20 = vpunpckhwd_avx(auVar22._0_16_,auVar13._0_16_);
  auVar3 = vpunpcklwd_avx(auVar22._16_16_,auVar13._16_16_);
  auVar1 = vpunpckhwd_avx(auVar22._16_16_,auVar13._16_16_);
  auVar14._0_16_ = ZEXT116(0) * auVar20 + ZEXT116(1) * auVar2;
  auVar14._16_16_ = ZEXT116(1) * auVar20;
  auVar10._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar3;
  auVar10._16_16_ = ZEXT116(1) * auVar1;
  auVar22 = vpmaddwd_avx2(auVar14,auVar21);
  auVar18 = vpmaddwd_avx2(auVar10,auVar8);
  auVar22 = vpaddd_avx2(auVar18,auVar22);
  auVar18 = vpmaddwd_avx2(auVar30,auVar14);
  auVar13 = vpmaddwd_avx2(auVar28,auVar10);
  auVar18 = vpaddd_avx2(auVar13,auVar18);
  auVar13 = vpmaddwd_avx2(auVar26,auVar14);
  auVar16 = vpmaddwd_avx2(auVar25,auVar10);
  auVar13 = vpaddd_avx2(auVar16,auVar13);
  auVar16 = vpmaddwd_avx2(auVar14,auVar17);
  auVar14 = vpmaddwd_avx2(auVar10,auVar15);
  auVar16 = vpaddd_avx2(auVar14,auVar16);
  auVar2 = vpunpcklwd_avx(auVar11._0_16_,auVar11._16_16_);
  auVar20 = vpunpckhwd_avx(auVar11._0_16_,auVar11._16_16_);
  auVar3 = vpunpcklwd_avx(auVar19._0_16_,auVar19._16_16_);
  auVar1 = vpunpckhwd_avx(auVar19._0_16_,auVar19._16_16_);
  auVar11._0_16_ = ZEXT116(0) * auVar20 + ZEXT116(1) * auVar2;
  auVar11._16_16_ = ZEXT116(1) * auVar20;
  auVar14 = vpmaddwd_avx2(auVar11,auVar6);
  auVar11 = vpmaddwd_avx2(auVar11,auVar24);
  iVar4 = 1 << (0x13U - (char)bit_depth & 0x1f);
  auVar23._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar3;
  auVar23._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
  auVar33._4_4_ = iVar4;
  auVar33._0_4_ = iVar4;
  auVar33._8_4_ = iVar4;
  auVar33._12_4_ = iVar4;
  auVar33._16_4_ = iVar4;
  auVar33._20_4_ = iVar4;
  auVar33._24_4_ = iVar4;
  auVar33._28_4_ = iVar4;
  auVar19 = vpmaddwd_avx2(auVar23,auVar7);
  auVar10 = vpmaddwd_avx2(auVar23,auVar12);
  auVar23 = vpsubd_avx2(auVar14,auVar19);
  auVar14 = vpaddd_avx2(auVar14,auVar33);
  auVar14 = vpaddd_avx2(auVar14,auVar19);
  auVar9 = vpsubd_avx2(auVar11,auVar10);
  auVar11 = vpaddd_avx2(auVar11,auVar33);
  auVar11 = vpaddd_avx2(auVar11,auVar10);
  uVar5 = 0x14 - bit_depth;
  auVar19 = vpaddd_avx2(auVar23,auVar33);
  auVar10 = vpaddd_avx2(auVar9,auVar33);
  auVar23 = vpaddd_avx2(auVar14,auVar22);
  auVar9 = vpsubd_avx2(auVar14,auVar22);
  auVar22 = vpaddd_avx2(auVar11,auVar18);
  auVar14 = vpsubd_avx2(auVar11,auVar18);
  auVar18 = vpaddd_avx2(auVar10,auVar13);
  auVar11 = vpsubd_avx2(auVar10,auVar13);
  auVar13 = vpaddd_avx2(auVar19,auVar16);
  auVar19 = vpsubd_avx2(auVar19,auVar16);
  auVar16 = vpsrad_avx2(auVar22,ZEXT416(uVar5));
  auVar22 = vpsrad_avx2(auVar14,ZEXT416(uVar5));
  auVar20 = ZEXT416(uVar5);
  auVar18 = vpsrad_avx2(auVar18,auVar20);
  auVar14 = vpsrad_avx2(auVar11,auVar20);
  auVar22 = vpackssdw_avx2(auVar18,auVar22);
  auVar18 = vpackssdw_avx2(auVar16,auVar14);
  auVar16 = vpsrad_avx2(auVar23,auVar20);
  auVar14 = vpsrad_avx2(auVar9,auVar20);
  auVar13 = vpsrad_avx2(auVar13,ZEXT416(uVar5));
  auVar13 = vpackssdw_avx2(auVar13,auVar14);
  auVar14 = vpsrad_avx2(auVar19,ZEXT416(uVar5));
  auVar16 = vpackssdw_avx2(auVar16,auVar14);
  auVar14 = vpunpcklwd_avx2(auVar16,auVar22);
  auVar22 = vpunpckhwd_avx2(auVar16,auVar22);
  auVar16 = vpunpcklwd_avx2(auVar18,auVar13);
  auVar18 = vpunpckhwd_avx2(auVar18,auVar13);
  auVar11 = vpunpcklwd_avx2(auVar14,auVar16);
  auVar13 = vpunpckhwd_avx2(auVar14,auVar16);
  auVar16 = vpunpcklwd_avx2(auVar22,auVar18);
  auVar22 = vpunpckhwd_avx2(auVar22,auVar18);
  auVar14 = vpunpcklqdq_avx2(auVar11,auVar16);
  auVar18 = vpunpckhqdq_avx2(auVar11,auVar16);
  auVar16 = vpunpcklqdq_avx2(auVar13,auVar22);
  auVar22 = vpunpckhqdq_avx2(auVar13,auVar22);
  auVar19._0_16_ = ZEXT116(0) * auVar18._0_16_ + ZEXT116(1) * auVar14._0_16_;
  auVar19._16_16_ = ZEXT116(0) * auVar14._16_16_ + ZEXT116(1) * auVar18._0_16_;
  auVar18 = vperm2i128_avx2(auVar14,auVar18,0x31);
  auVar13._0_16_ = ZEXT116(0) * auVar22._0_16_ + ZEXT116(1) * auVar16._0_16_;
  auVar13._16_16_ = ZEXT116(0) * auVar16._16_16_ + ZEXT116(1) * auVar22._0_16_;
  auVar22 = vperm2i128_avx2(auVar16,auVar22,0x31);
  *(undefined1 (*) [32])dst = auVar19;
  *(undefined1 (*) [32])(dst + 0x10) = auVar13;
  *(undefined1 (*) [32])(dst + 0x20) = auVar18;
  *(undefined1 (*) [32])(dst + 0x30) = auVar22;
  return;
}

Assistant:

void itrans_dct2_h8_w8_avx2(s16 *src, s16 *dst, int bit_depth)
{
    ALIGNED_32(s16 tmp[8 * 8]);
    dct2_butterfly_h8_avx2(src, 8, tmp, 8, 5, MAX_TX_DYNAMIC_RANGE);
    dct2_butterfly_h8_avx2(tmp, 8, dst, 8, 20 - bit_depth, bit_depth);
}